

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
MuteGameCommand::trigger
          (MuteGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  PlayerInfo *pPVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  undefined8 uVar7;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  char *in_R9;
  size_t sVar8;
  size_type __dnew;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)0x13ab67;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_60,(jessilib *)parameters._M_str,
             (char *)((jessilib *)parameters._M_str + parameters._M_len)," \t","",in_R9);
  if (local_60.first._M_len == 0) {
    pcVar6 = "Error: Too few parameters. Syntax: mute <player> [Reason]";
    uVar7 = 0x39;
    goto LAB_00132251;
  }
  sVar8 = 9;
  if (local_60.second._M_len != 0) {
    sVar8 = local_60.second._M_len;
  }
  pcVar6 = "No reason";
  if (local_60.second._M_len != 0) {
    pcVar6 = local_60.second._M_str;
  }
  pPVar4 = (PlayerInfo *)
           RenX::Server::getPlayerByPartName(source,local_60.first._M_len,local_60.first._M_str);
  if (pPVar4 == (PlayerInfo *)0x0) {
    pcVar6 = "Error: Player not found.";
    uVar7 = 0x18;
    goto LAB_00132251;
  }
  if (pPVar4 == player) {
    pcVar6 = "Error: You cannot mute yourself.";
  }
  else {
    if (player->access <= pPVar4->access) {
      local_80._M_dataplus._M_p = (pointer)0x25;
      local_80._M_string_length = 0x13d7a5;
      local_a0._M_dataplus._M_p = (pointer)pluginInstance.m_staffTitle._M_string_length;
      local_a0._M_string_length = (size_type)pluginInstance.m_staffTitle._M_dataplus._M_p;
      local_40._M_len = 2;
      local_40._M_str = "s.";
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (&local_c0,(jessilib *)&local_80,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_a0,&local_40,args_2);
      RenX::Server::sendMessage(source,player,local_c0._M_string_length,local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
        return;
      }
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      return;
    }
    RenX::Server::mute((PlayerInfo *)source);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_a0._M_dataplus._M_p = (pointer)0x19;
    local_80._M_dataplus._M_p =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   (&local_80,(size_type *)&local_a0,0);
    local_80.field_2._M_allocated_capacity = (size_type)local_a0._M_dataplus._M_p;
    builtin_strncpy(local_80._M_dataplus._M_p,"You have been muted for: ",0x19);
    local_80._M_string_length = (size_type)local_a0._M_dataplus._M_p;
    local_80._M_dataplus._M_p[local_a0._M_dataplus._M_p] = '\0';
    paVar2 = &local_a0.field_2;
    local_a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,pcVar6,pcVar6 + sVar8);
    uVar7 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar7 = local_80.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < (pointer)(local_80._M_string_length + local_a0._M_string_length)) {
      uVar7 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        uVar7 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < (pointer)(local_80._M_string_length + local_a0._M_string_length))
      goto LAB_001320bb;
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_a0,0,0,local_80._M_dataplus._M_p,local_80._M_string_length);
    }
    else {
LAB_001320bb:
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_80,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar5->_M_dataplus)._M_p;
    paVar1 = &pbVar5->field_2;
    if (paVar3 == paVar1) {
      local_c0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_c0.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
      local_c0.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
    }
    else {
      local_c0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_c0._M_dataplus._M_p = (pointer)paVar3;
    }
    local_c0._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
    pbVar5->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    RenX::Server::sendMessage(source,pPVar4,local_c0._M_string_length,local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0._M_dataplus._M_p,(ulong)(local_a0.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,(ulong)(local_80.field_2._M_allocated_capacity + 1))
      ;
    }
    pcVar6 = "Player has been muted from chat.";
  }
  uVar7 = 0x20;
LAB_00132251:
  RenX::Server::sendMessage(source,player,uVar7,pcVar6);
  return;
}

Assistant:

void MuteGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.first.empty()) {
		std::string_view reason = split_parameters.second;
		if (reason.empty()) {
			reason = "No reason"sv;
		}
		RenX::PlayerInfo *target = source->getPlayerByPartName(split_parameters.first);
		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (player == target)
			source->sendMessage(*player, "Error: You cannot mute yourself."sv);
		else if (target->access >= player->access)
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can not mute higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		else
		{
			source->mute(*target);
			source->sendMessage(*target, "You have been muted for: "s + std::string{reason});
			source->sendMessage(*player, "Player has been muted from chat."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: mute <player> [Reason]"sv);
}